

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

QList<QGraphicsItem_*> * __thiscall QGraphicsScene::selectedItems(QGraphicsScene *this)

{
  bool bVar1;
  QSet<QGraphicsItem_*> *in_RSI;
  QGraphicsItem *in_RDI;
  long in_FS_OFFSET;
  add_const_t<QSet<QGraphicsItem_*>_> *__range1;
  QGraphicsScene *that;
  QGraphicsScenePrivate *d;
  QGraphicsItem *item;
  const_iterator __end1;
  const_iterator __begin1;
  QSet<QGraphicsItem_*> actuallySelectedSet;
  const_iterator *in_stack_ffffffffffffff78;
  const_iterator *in_stack_ffffffffffffff80;
  QGraphicsItem *this_00;
  QSet<QGraphicsItem_*> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  d_func((QGraphicsScene *)0x9cad02);
  local_10.q_hash.d = (Hash)&DAT_aaaaaaaaaaaaaaaa;
  QSet<QGraphicsItem_*>::QSet((QSet<QGraphicsItem_*> *)0x9cad2a);
  d_func((QGraphicsScene *)0x9cad43);
  QSet<QGraphicsItem_*>::begin(in_RSI);
  QSet<QGraphicsItem_*>::end(in_RSI);
  while (bVar1 = QSet<QGraphicsItem_*>::const_iterator::operator!=
                           (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78), bVar1) {
    QSet<QGraphicsItem_*>::const_iterator::operator*((const_iterator *)0x9cadbb);
    bVar1 = QGraphicsItem::isSelected(in_RDI);
    if (bVar1) {
      QSet<QGraphicsItem_*>::operator<<
                ((QSet<QGraphicsItem_*> *)in_RDI,(QGraphicsItem **)in_stack_ffffffffffffff80);
    }
    QSet<QGraphicsItem_*>::const_iterator::operator++(in_stack_ffffffffffffff80);
  }
  d_func((QGraphicsScene *)0x9cadfa);
  QSet<QGraphicsItem_*>::operator=(&local_10,(QSet<QGraphicsItem_*> *)in_stack_ffffffffffffff78);
  QSet<QGraphicsItem_*>::values((QSet<QGraphicsItem_*> *)this_00);
  QSet<QGraphicsItem_*>::~QSet((QSet<QGraphicsItem_*> *)0x9cae33);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QList<QGraphicsItem_*> *)this_00;
}

Assistant:

QList<QGraphicsItem *> QGraphicsScene::selectedItems() const
{
    Q_D(const QGraphicsScene);

    // Optimization: Lazily removes items that are not selected.
    QGraphicsScene *that = const_cast<QGraphicsScene *>(this);
    QSet<QGraphicsItem *> actuallySelectedSet;
    for (QGraphicsItem *item : std::as_const(that->d_func()->selectedItems)) {
        if (item->isSelected())
            actuallySelectedSet << item;
    }

    that->d_func()->selectedItems = actuallySelectedSet;

    return d->selectedItems.values();
}